

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_set_infinity(secp256k1_gej *r)

{
  secp256k1_fe *in_RDI;
  
  *(undefined4 *)in_RDI[3].n = 1;
  secp256k1_fe_impl_set_int(in_RDI,0);
  secp256k1_fe_impl_set_int(in_RDI + 1,0);
  secp256k1_fe_impl_set_int(in_RDI + 2,0);
  secp256k1_gej_verify((secp256k1_gej *)0x94d502);
  return;
}

Assistant:

static void secp256k1_gej_set_infinity(secp256k1_gej *r) {
    r->infinity = 1;
    secp256k1_fe_set_int(&r->x, 0);
    secp256k1_fe_set_int(&r->y, 0);
    secp256k1_fe_set_int(&r->z, 0);

    SECP256K1_GEJ_VERIFY(r);
}